

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segapcm.c
# Opt level: O0

void SEGAPCM_update(void *chip,UINT32 samples,DEV_SMPL **outputs)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  char cVar6;
  uint uVar7;
  char cVar8;
  long lVar9;
  undefined1 local_54;
  uint local_4c;
  INT8 v;
  UINT32 i;
  uint uStack_40;
  UINT8 end;
  UINT32 loop;
  UINT32 addr;
  UINT32 offset;
  UINT8 *regs;
  int ch;
  segapcm_state *spcm;
  DEV_SMPL **outputs_local;
  UINT32 samples_local;
  void *chip_local;
  
  memset(*outputs,0,(ulong)samples << 2);
  memset(outputs[1],0,(ulong)samples << 2);
  if (*(long *)((long)chip + 0x28) != 0) {
    for (regs._4_4_ = 0; regs._4_4_ < 0x10; regs._4_4_ = regs._4_4_ + 1) {
      lVar9 = *(long *)((long)chip + 8) + (long)(regs._4_4_ << 3);
      if (((*(byte *)(lVar9 + 0x86) & 1) == 0) &&
         (*(char *)((long)chip + (long)regs._4_4_ + 0x33) == '\0')) {
        bVar1 = *(byte *)(lVar9 + 0x86);
        bVar2 = *(byte *)((long)chip + 0x31);
        bVar3 = *(byte *)((long)chip + 0x30);
        uStack_40 = (uint)*(byte *)(lVar9 + 0x85) << 0x10 | (uint)*(byte *)(lVar9 + 0x84) << 8 |
                    (uint)*(byte *)((long)chip + (long)regs._4_4_ + 0x10);
        bVar4 = *(byte *)(lVar9 + 5);
        bVar5 = *(byte *)(lVar9 + 4);
        cVar6 = *(char *)(lVar9 + 6);
        for (local_4c = 0; local_4c < samples; local_4c = local_4c + 1) {
          uVar7 = uStack_40;
          if ((uStack_40 >> 0x10 == (uint)(byte)(cVar6 + 1)) &&
             (uVar7 = (uint)bVar4 << 0x10 | (uint)bVar5 << 8, (*(byte *)(lVar9 + 0x86) & 2) != 0)) {
            *(byte *)(lVar9 + 0x86) = *(byte *)(lVar9 + 0x86) | 1;
            break;
          }
          uStack_40 = uVar7;
          cVar8 = *(char *)(*(long *)((long)chip + 0x28) +
                           (ulong)((uint)(bVar1 & bVar2) << (bVar3 & 0x1f) | uStack_40 >> 8)) +
                  -0x80;
          (*outputs)[local_4c] = (int)cVar8 * (*(byte *)(lVar9 + 2) & 0x7f) + (*outputs)[local_4c];
          outputs[1][local_4c] = (int)cVar8 * (*(byte *)(lVar9 + 3) & 0x7f) + outputs[1][local_4c];
          uStack_40 = uStack_40 + *(byte *)(lVar9 + 7) & 0xffffff;
        }
        *(char *)(lVar9 + 0x84) = (char)(uStack_40 >> 8);
        *(char *)(lVar9 + 0x85) = (char)(uStack_40 >> 0x10);
        if ((*(byte *)(lVar9 + 0x86) & 1) == 0) {
          local_54 = (undefined1)uStack_40;
        }
        else {
          local_54 = 0;
        }
        *(undefined1 *)((long)chip + (long)regs._4_4_ + 0x10) = local_54;
      }
    }
  }
  return;
}

Assistant:

static void SEGAPCM_update(void *chip, UINT32 samples, DEV_SMPL **outputs)
{
	segapcm_state *spcm = (segapcm_state *)chip;
	int ch;

	/* clear the buffers */
	memset(outputs[0], 0, samples*sizeof(DEV_SMPL));
	memset(outputs[1], 0, samples*sizeof(DEV_SMPL));
	if (spcm->rom == NULL)
		return;

	// reg      function
	// ------------------------------------------------
	// 0x00     ?
	// 0x01     ?
	// 0x02     volume left
	// 0x03     volume right
	// 0x04     loop address (08-15)
	// 0x05     loop address (16-23)
	// 0x06     end address
	// 0x07     address delta
	// 0x80     ?
	// 0x81     ?
	// 0x82     ?
	// 0x83     ?
	// 0x84     current address (08-15), 00-07 is internal?
	// 0x85     current address (16-23)
	// 0x86     bit 0: channel disable?
	//          bit 1: loop disable
	//          other bits: bank
	// 0x87     ?

	/* loop over channels */
	for (ch = 0; ch < 16; ch++)
	{
		UINT8 *regs = spcm->ram+8*ch;

		/* only process active channels */
		if (!(regs[0x86] & 1) && ! spcm->Muted[ch])
		{
			UINT32 offset = (regs[0x86] & spcm->bankmask) << spcm->bankshift;
			UINT32 addr = (regs[0x85] << 16) | (regs[0x84] << 8) | spcm->low[ch];
			UINT32 loop = (regs[0x05] << 16) | (regs[0x04] << 8);
			UINT8 end = regs[6] + 1;
			UINT32 i;

			/* loop over samples on this channel */
			for (i = 0; i < samples; i++)
			{
				INT8 v = 0;

				/* handle looping if we've hit the end */
				if ((addr >> 16) == end)
				{
					if (regs[0x86] & 2)
					{
						regs[0x86] |= 1;
						break;
					}
					else addr = loop;
				}

				/* fetch the sample */
				v = spcm->rom[offset | (addr >> 8)] - 0x80;
#ifdef _DEBUG
				if ((spcm->romusage[(offset | addr >> 8)] & 0x03) == 0x02 && (regs[2] || regs[3]))
					printf("Access to empty ROM section! (0x%06X)\n", offset | ((addr >> 8)));
				spcm->romusage[offset | (addr >> 8)] |= 0x01;
#endif

				/* apply panning and advance */
				// fixed Bitmask for volume multiplication, thanks to ctr -Valley Bell
				outputs[0][i] += v * (regs[2] & 0x7F);
				outputs[1][i] += v * (regs[3] & 0x7F);
				addr = (addr + regs[7]) & 0xffffff;
			}

			/* store back the updated address */
			regs[0x84] = addr >> 8;
			regs[0x85] = addr >> 16;
			spcm->low[ch] = regs[0x86] & 1 ? 0 : addr;
		}
	}
}